

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_del_nolock_(event *ev,int blocking)

{
  ushort uVar1;
  void *lock_;
  event_base *base;
  short *psVar2;
  unsigned_long uVar3;
  event_debug_entry *peVar4;
  int iVar5;
  int iVar6;
  undefined8 in_RAX;
  unsigned_long uVar7;
  event_debug_entry *peVar8;
  uint u;
  bool bVar9;
  undefined4 uVar10;
  
  uVar10 = (undefined4)((ulong)in_RAX >> 0x20);
  if (event_debug_logging_mask_ != 0) {
    event_debugx_("event_del: %p (fd %d), callback %p",ev,(ulong)(uint)ev->ev_fd,
                  (ev->ev_evcallback).evcb_cb_union.evcb_callback);
  }
  if (ev->ev_base == (event_base *)0x0) {
    return -1;
  }
  lock_ = ev->ev_base->th_base_lock;
  if (((lock_ == (void *)0x0) || (evthread_lock_debugging_enabled_ == 0)) ||
     (iVar5 = evthread_is_debug_lock_held_(lock_), iVar5 != 0)) {
    if ((blocking != 3) && (((ev->ev_evcallback).evcb_flags & 0x40) != 0)) {
      return 0;
    }
    if (0xff < (ushort)(ev->ev_evcallback).evcb_flags) {
      event_del_nolock__cold_1();
      goto LAB_001df776;
    }
    base = ev->ev_base;
    if ((((ev->ev_events & 8) != 0) && ((ev->ev_).ev_signal.ev_ncalls != 0)) &&
       (psVar2 = (ev->ev_).ev_signal.ev_pncalls, psVar2 != (short *)0x0)) {
      *psVar2 = 0;
    }
    if (((ev->ev_evcallback).evcb_flags & 1) != 0) {
      event_queue_remove_timeout(base,ev);
    }
    uVar1 = (ev->ev_evcallback).evcb_flags;
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 0x20) != 0) {
        event_queue_remove_active_later(base,&ev->ev_evcallback);
      }
    }
    else {
      event_queue_remove_active(base,&ev->ev_evcallback);
    }
    iVar5 = 0;
    bVar9 = false;
    if (((ev->ev_evcallback).evcb_flags & 2) == 0) {
LAB_001df638:
      if ((((bool)(evthread_id_fn_ != (_func_unsigned_long *)0x0 & iVar5 != -1 & bVar9)) &&
          (base->running_loop != 0)) &&
         (uVar3 = base->th_owner_id, uVar7 = (*evthread_id_fn_)(), uVar3 != uVar7)) {
        evthread_notify_base(base);
      }
      if (event_debug_mode_on_ == 0) {
LAB_001df6fd:
        event_debug_mode_too_late = 1;
        if ((((blocking != 0) &&
             (evthread_id_fn_ != (_func_unsigned_long *)0x0 && (event *)base->current_event == ev))
            && (uVar3 = base->th_owner_id, uVar7 = (*evthread_id_fn_)(), uVar3 != uVar7)) &&
           ((blocking == 1 || ((ev->ev_events & 0x40) == 0)))) {
          base->current_event_waiters = base->current_event_waiters + 1;
          if (base->current_event_cond != (void *)0x0) {
            (*evthread_cond_fns_.wait_condition)
                      (base->current_event_cond,base->th_base_lock,(timeval *)0x0);
          }
        }
        return iVar5;
      }
      if (event_debug_map_lock_ != (void *)0x0) {
        (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
      }
      if (global_debug_map.hth_table == (event_debug_entry **)0x0) {
        peVar8 = (event_debug_entry *)0x0;
      }
      else {
        peVar4 = (event_debug_entry *)
                 (global_debug_map.hth_table +
                 ((ulong)ev >> 6 & 0x3ffffff) % (ulong)global_debug_map.hth_table_length);
        do {
          peVar8 = peVar4;
          peVar4 = (peVar8->node).hte_next;
          if (peVar4 == (event_debug_entry *)0x0) break;
        } while (peVar4->ptr != ev);
      }
      if (peVar8 == (event_debug_entry *)0x0) {
        peVar8 = (event_debug_entry *)0x0;
      }
      else {
        peVar8 = (peVar8->node).hte_next;
      }
      if (peVar8 != (event_debug_entry *)0x0) {
        peVar8->field_0x10 = peVar8->field_0x10 & 0xfe;
        if (event_debug_map_lock_ != (void *)0x0) {
          (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
        }
        goto LAB_001df6fd;
      }
      goto LAB_001df788;
    }
    if (((base->th_base_lock == (void *)0x0) || (evthread_lock_debugging_enabled_ == 0)) ||
       (iVar5 = evthread_is_debug_lock_held_(base->th_base_lock), iVar5 != 0)) {
      uVar1 = (ev->ev_evcallback).evcb_flags;
      if ((uVar1 & 2) != 0) {
        base->event_count = base->event_count - (uint)((uVar1 & 0x10) == 0);
        psVar2 = &(ev->ev_evcallback).evcb_flags;
        *(byte *)psVar2 = (byte)*psVar2 & 0xfd;
        if ((ev->ev_events & 0x86) == 0) {
          iVar6 = evmap_signal_del_(base,ev->ev_fd,ev);
        }
        else {
          iVar6 = evmap_io_del_(base,ev->ev_fd,ev);
        }
        bVar9 = iVar6 == 1;
        iVar5 = 0;
        if (!bVar9) {
          iVar5 = iVar6;
        }
        if ((base->virtual_event_count < 1) && (base->event_count < 1)) {
          bVar9 = base->event_count_active == 0 || iVar6 == 1;
        }
        goto LAB_001df638;
      }
      goto LAB_001df77b;
    }
  }
  else {
LAB_001df776:
    event_del_nolock__cold_4();
LAB_001df77b:
    event_del_nolock__cold_2();
  }
  event_del_nolock__cold_3();
LAB_001df788:
  event_errx(-0x21522153,
             "%s: noting a del on a non-setup event %p (events: 0x%x, fd: %d, flags: 0x%x)",
             "event_debug_note_del_",ev,(ulong)(uint)(int)ev->ev_events,(ulong)(uint)ev->ev_fd,
             CONCAT44(uVar10,(int)(ev->ev_evcallback).evcb_flags));
}

Assistant:

int
event_del_nolock_(struct event *ev, int blocking)
{
	struct event_base *base;
	int res = 0, notify = 0;

	event_debug(("event_del: %p (fd "EV_SOCK_FMT"), callback %p",
		ev, EV_SOCK_ARG(ev->ev_fd), ev->ev_callback));

	/* An event without a base has not been added */
	if (ev->ev_base == NULL)
		return (-1);

	EVENT_BASE_ASSERT_LOCKED(ev->ev_base);

	if (blocking != EVENT_DEL_EVEN_IF_FINALIZING) {
		if (ev->ev_flags & EVLIST_FINALIZING) {
			/* XXXX Debug */
			return 0;
		}
	}

	base = ev->ev_base;

	EVUTIL_ASSERT(!(ev->ev_flags & ~EVLIST_ALL));

	/* See if we are just active executing this event in a loop */
	if (ev->ev_events & EV_SIGNAL) {
		if (ev->ev_ncalls && ev->ev_pncalls) {
			/* Abort loop */
			*ev->ev_pncalls = 0;
		}
	}

	if (ev->ev_flags & EVLIST_TIMEOUT) {
		/* NOTE: We never need to notify the main thread because of a
		 * deleted timeout event: all that could happen if we don't is
		 * that the dispatch loop might wake up too early.  But the
		 * point of notifying the main thread _is_ to wake up the
		 * dispatch loop early anyway, so we wouldn't gain anything by
		 * doing it.
		 */
		event_queue_remove_timeout(base, ev);
	}

	if (ev->ev_flags & EVLIST_ACTIVE)
		event_queue_remove_active(base, event_to_event_callback(ev));
	else if (ev->ev_flags & EVLIST_ACTIVE_LATER)
		event_queue_remove_active_later(base, event_to_event_callback(ev));

	if (ev->ev_flags & EVLIST_INSERTED) {
		event_queue_remove_inserted(base, ev);
		if (ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED))
			res = evmap_io_del_(base, ev->ev_fd, ev);
		else
			res = evmap_signal_del_(base, (int)ev->ev_fd, ev);
		if (res == 1) {
			/* evmap says we need to notify the main thread. */
			notify = 1;
			res = 0;
		}
		/* If we do not have events, let's notify event base so it can
		 * exit without waiting */
		if (!event_haveevents(base) && !N_ACTIVE_CALLBACKS(base))
			notify = 1;
	}

	/* if we are not in the right thread, we need to wake up the loop */
	if (res != -1 && notify && EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);

	event_debug_note_del_(ev);

	/* If the main thread is currently executing this event's callback,
	 * and we are not the main thread, then we want to wait until the
	 * callback is done before returning. That way, when this function
	 * returns, it will be safe to free the user-supplied argument.
	 */
#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (blocking != EVENT_DEL_NOBLOCK &&
	    base->current_event == event_to_event_callback(ev) &&
	    !EVBASE_IN_THREAD(base) &&
	    (blocking == EVENT_DEL_BLOCK || !(ev->ev_events & EV_FINALIZE))) {
		++base->current_event_waiters;
		EVTHREAD_COND_WAIT(base->current_event_cond, base->th_base_lock);
	}
#endif

	return (res);
}